

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonQuoteFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  Mem *pMVar2;
  JsonString jx;
  JsonString local_a0;
  
  local_a0.zBuf = local_a0.zSpace;
  local_a0.nAlloc = 100;
  local_a0.nUsed = 0;
  local_a0.bStatic = '\x01';
  local_a0.bErr = '\0';
  local_a0.pCtx = ctx;
  jsonAppendValue(&local_a0,*argv);
  if (local_a0.bErr == '\0') {
    sqlite3_result_text64
              (local_a0.pCtx,local_a0.zBuf,local_a0.nUsed,
               (_func_void_void_ptr *)(-(ulong)(local_a0.bStatic != '\0') | 0x11ccb0),'\x01');
  }
  pMVar2 = ctx->pOut;
  pMVar2->eSubtype = 'J';
  pbVar1 = (byte *)((long)&pMVar2->flags + 1);
  *pbVar1 = *pbVar1 | 0x80;
  return;
}

Assistant:

static void jsonQuoteFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString jx;
  UNUSED_PARAM(argc);

  jsonInit(&jx, ctx);
  jsonAppendValue(&jx, argv[0]);
  jsonResult(&jx);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}